

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

TX_SIZE calculate_tx_size(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,uint var,uint sse,
                         int *force_skip)

{
  int iVar1;
  uint uVar2;
  uint in_ECX;
  long in_RDX;
  byte in_SIL;
  long in_RDI;
  uint in_R8D;
  undefined4 *in_R9;
  uint qstep_sq;
  int qstep;
  int mult [4];
  int qband;
  uint is_high_var;
  uint var_thresh;
  int multiplier;
  TxfmSearchParams *txfm_params;
  TX_SIZE tx_size;
  MACROBLOCKD *xd;
  int local_68 [6];
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  long local_40;
  byte local_31;
  long local_30;
  byte local_9;
  
  local_30 = in_RDX + 0x1a0;
  local_40 = in_RDX + 0x24dcc;
  local_9 = in_SIL;
  if (*(char *)(in_RDX + 0x24df0) == '\x02') {
    local_44 = 8;
    local_48 = 0;
    local_4c = 1;
    if (*(int *)(in_RDI + 0x60dc0) != 0) {
      local_50 = *(int *)(in_RDX + 0x4208) >> 6;
      local_68[0] = 8;
      local_68[1] = 7;
      local_68[2] = 6;
      local_68[3] = 5;
      local_44 = local_68[local_50];
      iVar1 = (int)*(short *)(*(long *)(in_RDX + 0x80) + 2) >>
              ((char)*(undefined4 *)(in_RDX + 0x2b40) - 5U & 0x1f);
      uVar2 = iVar1 * iVar1;
      local_48 = uVar2 * 2;
      if (1 < *(int *)(in_RDI + 0x60dc0)) {
        if ((((in_R8D < uVar2) && (*(uint *)(in_RDX + 0x25640) < uVar2)) &&
            (*(char *)(in_RDX + 0x25626) == '\0')) && (*(char *)(in_RDX + 0x25627) == '\0')) {
          *in_R9 = 1;
        }
        local_4c = (uint)(local_48 <= in_ECX);
      }
    }
    if ((in_ECX * local_44 >> 2 < in_R8D) || (in_ECX < local_48)) {
      if (""[in_SIL] < ""[*(byte *)(in_RDX + 0x24df0)]) {
        local_31 = ""[in_SIL];
      }
      else {
        local_31 = ""[*(byte *)(in_RDX + 0x24df0)];
      }
    }
    else {
      local_31 = 1;
    }
    if (((*(char *)(in_RDI + 0x42400) == '\x03') &&
        (iVar1 = cyclic_refresh_segment_id_boosted
                           ((uint)((byte)*(undefined2 *)(**(long **)(in_RDX + 0x2058) + 0xa7) & 7)),
        iVar1 != 0)) && (local_4c != 0)) {
      local_31 = 1;
    }
    else if (2 < local_31) {
      local_31 = 2;
    }
  }
  else if (""[in_SIL] < ""[*(byte *)(in_RDX + 0x24df0)]) {
    local_31 = ""[in_SIL];
  }
  else {
    local_31 = ""[*(byte *)(in_RDX + 0x24df0)];
  }
  if ((*(char *)(local_40 + 0x24) != '\0') && (9 < local_9)) {
    local_31 = 2;
  }
  if (1 < local_31) {
    local_31 = 2;
  }
  return local_31;
}

Assistant:

static TX_SIZE calculate_tx_size(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                 MACROBLOCK *const x, unsigned int var,
                                 unsigned int sse, int *force_skip) {
  MACROBLOCKD *const xd = &x->e_mbd;
  TX_SIZE tx_size;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT) {
    int multiplier = 8;
    unsigned int var_thresh = 0;
    unsigned int is_high_var = 1;
    // Use quantizer based thresholds to determine transform size.
    if (cpi->sf.rt_sf.tx_size_level_based_on_qstep) {
      const int qband = x->qindex >> (QINDEX_BITS - 2);
      const int mult[4] = { 8, 7, 6, 5 };
      assert(qband < 4);
      multiplier = mult[qband];
      const int qstep = x->plane[AOM_PLANE_Y].dequant_QTX[1] >> (xd->bd - 5);
      const unsigned int qstep_sq = qstep * qstep;
      var_thresh = qstep_sq * 2;
      if (cpi->sf.rt_sf.tx_size_level_based_on_qstep >= 2) {
        // If the sse is low for low source variance blocks, mark those as
        // transform skip.
        // Note: Though qstep_sq is based on ac qstep, the threshold is kept
        // low so that reliable early estimate of tx skip can be obtained
        // through its comparison with sse.
        if (sse < qstep_sq && x->source_variance < qstep_sq &&
            x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
            x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 0)
          *force_skip = 1;
        // Further lower transform size based on aq mode only if residual
        // variance is high.
        is_high_var = (var >= var_thresh);
      }
    }
    // Choose larger transform size for blocks where dc component is dominant or
    // the ac component is low.
    if (sse > ((var * multiplier) >> 2) || (var < var_thresh))
      tx_size =
          AOMMIN(max_txsize_lookup[bsize],
                 tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]);
    else
      tx_size = TX_8X8;

    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
        cyclic_refresh_segment_id_boosted(xd->mi[0]->segment_id) && is_high_var)
      tx_size = TX_8X8;
    else if (tx_size > TX_16X16)
      tx_size = TX_16X16;
  } else {
    tx_size =
        AOMMIN(max_txsize_lookup[bsize],
               tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]);
  }

  if (CAP_TX_SIZE_FOR_BSIZE_GT32(txfm_params->tx_mode_search_type, bsize))
    tx_size = TX_SIZE_FOR_BSIZE_GT32;

  return AOMMIN(tx_size, TX_16X16);
}